

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.cpp
# Opt level: O3

bool runArmips(ArmipsArguments *arguments)

{
  int iVar1;
  long lVar2;
  CMacro *this;
  bool bVar3;
  pointer pbVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  ulong uVar7;
  long lVar8;
  wstring equline;
  wstring local_50;
  
  Global.Revalidate = true;
  Global.Section = 0;
  Global.Radix = 10;
  Global.nocash = false;
  Global.relativeInclude = false;
  Global.IncludeNestingLevel = 0;
  Global.MacroNestingLevel = 0;
  Global.FileInfo._24_8_ = Global.FileInfo._24_8_ & 0xffffffff00000000;
  Global.FileInfo.TotalLineCount = 0;
  Global.DebugMessages = 0;
  Global.validationPasses = 0;
  Arch = &InvalidArchitecture.super_CArchitecture;
  Logger::clear();
  SymbolData::clear(&Global.symData);
  EncodingTable::clear(&Global.Table);
  SymbolTable::clear(&Global.symbolTable);
  TempData::clear(&Global.tempData);
  if (Global.conditionData.conditions.
      super__Vector_base<ConditionData::Entry,_std::allocator<ConditionData::Entry>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      Global.conditionData.conditions.
      super__Vector_base<ConditionData::Entry,_std::allocator<ConditionData::Entry>_>._M_impl.
      super__Vector_impl_data._M_start) {
    Global.conditionData.conditions.
    super__Vector_base<ConditionData::Entry,_std::allocator<ConditionData::Entry>_>._M_impl.
    super__Vector_impl_data._M_finish =
         Global.conditionData.conditions.
         super__Vector_base<ConditionData::Entry,_std::allocator<ConditionData::Entry>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (Global.areaData.entries.super__Vector_base<AreaData::Entry,_std::allocator<AreaData::Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      Global.areaData.entries.super__Vector_base<AreaData::Entry,_std::allocator<AreaData::Entry>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    Global.areaData.entries.super__Vector_base<AreaData::Entry,_std::allocator<AreaData::Entry>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         Global.areaData.entries.
         super__Vector_base<AreaData::Entry,_std::allocator<AreaData::Entry>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (Global.Commands.super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      Global.Commands.super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    Global.Commands.super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         Global.Commands.
         super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&Global.FileInfo);
  Global.FileInfo.FileCount = 0;
  Global.FileInfo.FileNum = 0;
  Global.FileInfo.LineNumber = 0;
  Global.FileInfo.TotalLineCount = 0;
  CArmArchitecture::clear(&Arm);
  Logger::silent = arguments->silent;
  Logger::errorOnWarning = arguments->errorOnWarning;
  if ((arguments->symFileName)._M_string_length != 0) {
    iVar1 = arguments->symFileVersion;
    std::__cxx11::wstring::_M_assign((wstring *)&Global.symData);
    Global.symData.nocashSymVersion = iVar1;
  }
  if ((arguments->tempFileName)._M_string_length != 0) {
    std::__cxx11::wstring::_M_assign((wstring *)&Global.tempData.file.fileName);
  }
  pbVar4 = (arguments->equList).
           super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((arguments->equList).
      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar4) {
    lVar8 = 8;
    uVar7 = 0;
    do {
      lVar2 = *(long *)((long)pbVar4 + lVar8 + -8);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)&local_50,lVar2,
                 lVar2 + *(long *)((long)&(pbVar4->_M_dataplus)._M_p + lVar8) * 4);
      CheckEquLabel(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar7 = uVar7 + 1;
      pbVar4 = (arguments->equList).
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x20;
    } while (uVar7 < (ulong)((long)(arguments->equList).
                                   super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5));
  }
  SymbolTable::addLabels(&Global.symbolTable,&arguments->labels);
  if (arguments->mode == File) {
    Global.memoryMode = false;
    LoadAssemblyFile(&arguments->inputFileName,GUESS);
  }
  else if (arguments->mode == Memory) {
    Global.memoryMode = true;
    Global.memoryFile = arguments->memoryFile;
    LoadAssemblyContent(&arguments->content);
  }
  if (Logger::error == false) {
    bVar3 = EncodeAssembly();
  }
  else {
    bVar3 = false;
  }
  if (arguments->errorsResult != (StringList *)0x0) {
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)&local_50,&Logger::errors_abi_cxx11_);
    if ((pointer)local_50._M_string_length != local_50._M_dataplus._M_p) {
      lVar8 = 0;
      uVar7 = 0;
      do {
        std::
        vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::push_back(arguments->errorsResult,(value_type *)((long)local_50._M_dataplus._M_p + lVar8))
        ;
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x20;
      } while (uVar7 < (ulong)((long)(local_50._M_string_length - (long)local_50._M_dataplus._M_p)
                              >> 5));
    }
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)&local_50);
  }
  ppCVar5 = Global.Commands.
            super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar6 = Global.Commands.
            super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (Global.Commands.super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      Global.Commands.super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      if (ppCVar5[uVar7] != (CAssemblerCommand *)0x0) {
        (*ppCVar5[uVar7]->_vptr_CAssemblerCommand[1])();
        ppCVar5 = Global.Commands.
                  super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppCVar6 = Global.Commands.
                  super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)ppCVar6 - (long)ppCVar5 >> 3));
  }
  if (Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      this = Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7];
      if (this != (CMacro *)0x0) {
        CMacro::~CMacro(this);
      }
      operator_delete(this);
      uVar7 = uVar7 + 1;
      ppCVar5 = Global.Commands.
                super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppCVar6 = Global.Commands.
                super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar7 < (ulong)((long)Global.Macros.
                                   super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)Global.Macros.
                                   super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 3));
  }
  if (ppCVar6 != ppCVar5) {
    Global.Commands.super__Vector_base<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppCVar5;
  }
  if (Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  return bVar3;
}

Assistant:

bool runArmips(ArmipsArguments& arguments)
{
	// initialize and reset global data
	Global.Radix = 10;
	Global.Revalidate = true;
	Global.Section = 0;
	Global.nocash = false;
	Global.IncludeNestingLevel = 0;
	Global.MacroNestingLevel = 0;
	Global.FileInfo.FileCount = 0;
	Global.FileInfo.TotalLineCount = 0;
	Global.DebugMessages = 0;
	Global.relativeInclude = false;
	Global.validationPasses = 0;
	Arch = &InvalidArchitecture;

	Logger::clear();
	Global.symData.clear();
	Global.Table.clear();
	Global.symbolTable.clear();
	Global.tempData.clear();
	Global.conditionData.clear();
	Global.areaData.clear();
	Global.Commands.clear();
	Global.Macros.clear();

	Global.FileInfo.FileList.Clear();
	Global.FileInfo.FileCount = 0;
	Global.FileInfo.TotalLineCount = 0;
	Global.FileInfo.LineNumber = 0;
	Global.FileInfo.FileNum = 0;

	Arm.clear();

	// process arguments
	Logger::setSilent(arguments.silent);
	Logger::setErrorOnWarning(arguments.errorOnWarning);

	if (!arguments.symFileName.empty())
		Global.symData.setNocashSymFileName(arguments.symFileName,arguments.symFileVersion);

	if (!arguments.tempFileName.empty())
		Global.tempData.setFileName(arguments.tempFileName);

	for (size_t i = 0; i < arguments.equList.size(); i++)
	{
		std::wstring equline = arguments.equList.at(i);
		CheckEquLabel(equline);
	}

	Global.symbolTable.addLabels(arguments.labels);

	// run assembler
	switch (arguments.mode)
	{
	case ArmipsMode::File:
		Global.memoryMode = false;
		LoadAssemblyFile(arguments.inputFileName);
		break;
	case ArmipsMode::Memory:
		Global.memoryMode = true;
		Global.memoryFile = arguments.memoryFile;
		LoadAssemblyContent(arguments.content);
		break;
	}

	bool result = !Logger::hasError();
	if (result == true)
		result = EncodeAssembly();

	// return errors
	if (arguments.errorsResult != NULL)
	{
		StringList errors = Logger::getErrors();
		for (size_t i = 0; i < errors.size(); i++)
			arguments.errorsResult->push_back(errors[i]);
	}

	// cleanup
	for (size_t i = 0; i < Global.Commands.size(); i++)
		delete Global.Commands[i];	

	for (size_t i = 0; i < Global.Macros.size(); i++)
		delete Global.Macros[i];

	Global.Commands.clear();
	Global.Macros.clear();

	return result;
}